

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  size_t sVar6;
  char *buf_ptr;
  ptrdiff_t _Num;
  ulong uVar7;
  scoped_padder p;
  format_int fStack_78;
  scoped_padder local_58;
  
  uVar1 = (msg->source).line;
  if (uVar1 != 0) {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar2 = strlen((msg->source).filename);
      uVar5 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (uVar5 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      sVar6 = sVar2 + ((uVar5 + 1) -
                      (uint)(uVar1 < *(uint *)(fmt::v6::internal::basic_data<void>::
                                               zero_or_powers_of_10_32 + (ulong)uVar5 * 4))) + 1;
    }
    else {
      sVar6 = 0;
    }
    scoped_padder::scoped_padder(&local_58,sVar6,&(this->super_flag_formatter).padinfo_,dest);
    pcVar4 = (msg->source).filename;
    sVar2 = strlen(pcVar4);
    sVar6 = (dest->super_buffer<char>).size_;
    if (pcVar4 != (char *)0x0) {
      sVar6 = sVar6 + sVar2;
      if ((dest->super_buffer<char>).capacity_ < sVar6) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar6);
      }
      if (sVar2 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar4,sVar2);
      }
      (dest->super_buffer<char>).size_ = sVar6;
    }
    uVar7 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar7 = sVar6 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar6] = ':';
    uVar1 = (msg->source).line;
    uVar5 = -uVar1;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    pcVar3 = fmt::v6::format_int::format_decimal(&fStack_78,(ulong)uVar5);
    pcVar4 = pcVar3;
    if ((int)uVar1 < 0) {
      pcVar4 = pcVar3 + -1;
      pcVar3[-1] = '-';
    }
    sVar2 = (long)(fStack_78.buffer_ + 0x15) - (long)pcVar4;
    uVar7 = (dest->super_buffer<char>).size_ + sVar2;
    fStack_78.str_ = pcVar4;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar7);
    }
    if (fStack_78.buffer_ + 0x15 != pcVar4) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar4,sVar2);
    }
    (dest->super_buffer<char>).size_ = uVar7;
    scoped_padder::~scoped_padder(&local_58);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}